

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O2

void __thiscall HACD::TMMTriangle::Initialize(TMMTriangle *this)

{
  long lVar1;
  
  this->m_id = 0;
  for (lVar1 = 1; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->m_edges[lVar1 + -1] = (CircularListElement<HACD::TMMEdge> *)0x0;
    this->m_vertices[0] = (CircularListElement<HACD::TMMVertex> *)0x0;
  }
  this->m_visible = false;
  (this->m_incidentPoints).m_data = (long *)0x0;
  (this->m_incidentPoints).m_size = 0;
  (this->m_incidentPoints).m_maxSize = 0x10;
  return;
}

Assistant:

void TMMTriangle::Initialize()
	{
        m_id = 0;
		for(int i = 0; i < 3; i++)
		{
			m_edges[i] = 0;
			m_vertices[0] = 0;
		}
		m_visible = false;
        m_incidentPoints.Initialize();
    }